

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1869::run(TestCase1869 *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  float local_218;
  bool local_211;
  float local_210;
  DebugExpression<float> DStack_20c;
  bool _kj_shouldLog_3;
  undefined1 local_208 [8];
  DebugComparison<float,_const_float_&> _kjCondition_3;
  float local_1d8;
  DebugExpression<float> DStack_1d4;
  bool _kj_shouldLog_2;
  undefined1 local_1d0 [8];
  DebugComparison<float,_const_float_&> _kjCondition_2;
  bool local_19d;
  float local_19c;
  float fStack_198;
  bool _kj_shouldLog_1;
  DebugExpression<float> local_194;
  undefined1 local_190 [8];
  DebugComparison<float,_float> _kjCondition_1;
  bool local_165;
  float local_164;
  float fStack_160;
  bool _kj_shouldLog;
  DebugExpression<float> local_15c;
  undefined1 local_158 [8];
  DebugComparison<float,_float> _kjCondition;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder message;
  TestCase1869 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestWholeFloatDefault>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  fStack_160 = 123.0;
  local_15c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffea0);
  local_164 = capnproto_test::capnp::test::TestWholeFloatDefault::Builder::getField
                        ((Builder *)local_128);
  kj::_::DebugExpression<float>::operator==
            ((DebugComparison<float,_float> *)local_158,&local_15c,&local_164);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_158);
  if (!bVar1) {
    local_165 = kj::_::Debug::shouldLog(ERROR);
    while (local_165 != false) {
      _kjCondition_1._28_4_ = 0x42f60000;
      _kjCondition_1._24_4_ =
           capnproto_test::capnp::test::TestWholeFloatDefault::Builder::getField
                     ((Builder *)local_128);
      kj::_::Debug::log<char_const(&)[47],kj::_::DebugComparison<float,float>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x751,ERROR,
                 "\"failed: expected \" \"(123.0f) == (root.getField())\", _kjCondition, 123.0f, root.getField()"
                 ,(char (*) [47])"failed: expected (123.0f) == (root.getField())",
                 (DebugComparison<float,_float> *)local_158,(float *)&_kjCondition_1.field_0x1c,
                 (float *)&_kjCondition_1.result);
      local_165 = false;
    }
  }
  fStack_198 = 2e+30;
  local_194 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffe68);
  local_19c = capnproto_test::capnp::test::TestWholeFloatDefault::Builder::getBigField
                        ((Builder *)local_128);
  kj::_::DebugExpression<float>::operator==
            ((DebugComparison<float,_float> *)local_190,&local_194,&local_19c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_190);
  if (!bVar1) {
    local_19d = kj::_::Debug::shouldLog(ERROR);
    while (local_19d != false) {
      _kjCondition_2._36_4_ = 0x71c9f2ca;
      _kjCondition_2._32_4_ =
           capnproto_test::capnp::test::TestWholeFloatDefault::Builder::getBigField
                     ((Builder *)local_128);
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<float,float>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x752,ERROR,
                 "\"failed: expected \" \"(2e30f) == (root.getBigField())\", _kjCondition, 2e30f, root.getBigField()"
                 ,(char (*) [49])"failed: expected (2e30f) == (root.getBigField())",
                 (DebugComparison<float,_float> *)local_190,(float *)&_kjCondition_2.field_0x24,
                 (float *)&_kjCondition_2.result);
      local_19d = false;
    }
  }
  local_1d8 = 456.0;
  DStack_1d4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1d8);
  kj::_::DebugExpression<float>::operator==
            ((DebugComparison<float,_const_float_&> *)local_1d0,&stack0xfffffffffffffe2c,
             &capnproto_test::capnp::test::TestWholeFloatDefault::CONSTANT);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1d0);
  if (!bVar1) {
    _kjCondition_3._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_3._39_1_ != '\0') {
      _kjCondition_3.result = false;
      _kjCondition_3._33_3_ = 0x43e400;
      kj::_::Debug::
      log<char_const(&)[69],kj::_::DebugComparison<float,float_const&>&,float,float_const&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x753,ERROR,
                 "\"failed: expected \" \"(456.0f) == (test::TestWholeFloatDefault::CONSTANT)\", _kjCondition, 456.0f, test::TestWholeFloatDefault::CONSTANT"
                 ,(char (*) [69])
                  "failed: expected (456.0f) == (test::TestWholeFloatDefault::CONSTANT)",
                 (DebugComparison<float,_const_float_&> *)local_1d0,(float *)&_kjCondition_3.result,
                 &capnproto_test::capnp::test::TestWholeFloatDefault::CONSTANT);
      _kjCondition_3._39_1_ = 0;
    }
  }
  local_210 = 4e+30;
  DStack_20c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_210);
  kj::_::DebugExpression<float>::operator==
            ((DebugComparison<float,_const_float_&> *)local_208,&stack0xfffffffffffffdf4,
             &capnproto_test::capnp::test::TestWholeFloatDefault::BIG_CONSTANT);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_208);
  if (!bVar1) {
    local_211 = kj::_::Debug::shouldLog(ERROR);
    while (local_211 != false) {
      local_218 = 4e+30;
      kj::_::Debug::
      log<char_const(&)[72],kj::_::DebugComparison<float,float_const&>&,float,float_const&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x754,ERROR,
                 "\"failed: expected \" \"(4e30f) == (test::TestWholeFloatDefault::BIG_CONSTANT)\", _kjCondition, 4e30f, test::TestWholeFloatDefault::BIG_CONSTANT"
                 ,(char (*) [72])
                  "failed: expected (4e30f) == (test::TestWholeFloatDefault::BIG_CONSTANT)",
                 (DebugComparison<float,_const_float_&> *)local_208,&local_218,
                 &capnproto_test::capnp::test::TestWholeFloatDefault::BIG_CONSTANT);
      local_211 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Encoding, WholeFloatDefault) {
  MallocMessageBuilder message;
  auto root = message.initRoot<test::TestWholeFloatDefault>();

  EXPECT_EQ(123.0f, root.getField());
  EXPECT_EQ(2e30f, root.getBigField());
  EXPECT_EQ(456.0f, test::TestWholeFloatDefault::CONSTANT);
  EXPECT_EQ(4e30f, test::TestWholeFloatDefault::BIG_CONSTANT);
}